

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::CompilerMSL(CompilerMSL *this,ParsedIR *ir_)

{
  _Rb_tree_header *p_Var1;
  
  CompilerGLSL::CompilerGLSL(&this->super_CompilerGLSL,ir_);
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerMSL_00357cb0;
  (this->function_global_vars)._M_h._M_buckets = &(this->function_global_vars)._M_h._M_single_bucket
  ;
  (this->function_global_vars)._M_h._M_bucket_count = 1;
  (this->function_global_vars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->function_global_vars)._M_h._M_element_count = 0;
  (this->function_global_vars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->function_global_vars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->function_global_vars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->builtin_frag_coord_id = 0;
  this->builtin_sample_id_id = 0;
  this->builtin_sample_mask_id = 0;
  this->builtin_vertex_idx_id = 0;
  this->builtin_base_vertex_id = 0;
  this->builtin_instance_idx_id = 0;
  this->builtin_base_instance_id = 0;
  this->builtin_view_idx_id = 0;
  this->builtin_layer_id = 0;
  this->builtin_invocation_id_id = 0;
  this->builtin_primitive_id_id = 0;
  this->builtin_subgroup_invocation_id_id = 0;
  this->builtin_subgroup_size_id = 0;
  this->builtin_dispatch_base_id = 0;
  this->builtin_stage_input_size_id = 0;
  this->swizzle_buffer_id = 0;
  this->buffer_size_buffer_id = 0;
  this->view_mask_buffer_id = 0;
  this->dynamic_offsets_buffer_id = 0;
  this->uint_type_id = 0;
  this->does_shader_write_sample_mask = false;
  (this->msl_options).platform = macOS;
  (this->msl_options).msl_version = 0x27d8;
  (this->msl_options).texel_buffer_texture_width = 0x1000;
  (this->msl_options).swizzle_buffer_index = 0x1e;
  (this->msl_options).indirect_params_buffer_index = 0x1d;
  (this->msl_options).shader_output_buffer_index = 0x1c;
  (this->msl_options).shader_patch_output_buffer_index = 0x1b;
  (this->msl_options).shader_tess_factor_buffer_index = 0x1a;
  (this->msl_options).buffer_size_buffer_index = 0x19;
  (this->msl_options).view_mask_buffer_index = 0x18;
  (this->msl_options).dynamic_offsets_buffer_index = 0x17;
  (this->msl_options).shader_input_buffer_index = 0x16;
  (this->msl_options).shader_index_buffer_index = 0x15;
  (this->msl_options).shader_input_wg_index = 0;
  (this->msl_options).device_index = 0;
  (this->msl_options).enable_frag_output_mask = 0xffffffff;
  (this->msl_options).additional_fixed_sample_mask = 0xffffffff;
  (this->msl_options).enable_point_size_builtin = true;
  (this->msl_options).enable_frag_depth_builtin = true;
  (this->msl_options).enable_frag_stencil_ref_builtin = true;
  (this->msl_options).disable_rasterization = false;
  (this->msl_options).capture_output_to_buffer = false;
  (this->msl_options).swizzle_texture_samples = false;
  (this->msl_options).tess_domain_origin_lower_left = false;
  (this->msl_options).multiview = false;
  (this->msl_options).multiview_layered_rendering = true;
  (this->msl_options).view_index_from_device_index = false;
  (this->msl_options).dispatch_base = false;
  (this->msl_options).texture_1D_as_2D = false;
  (this->msl_options).argument_buffers = false;
  (this->msl_options).enable_base_index_zero = false;
  (this->msl_options).pad_fragment_output_components = false;
  (this->msl_options).ios_support_base_vertex_instance = false;
  (this->msl_options).ios_use_framebuffer_fetch_subpasses = false;
  (this->msl_options).ios_support_base_vertex_instance = false;
  (this->msl_options).ios_use_framebuffer_fetch_subpasses = false;
  (this->msl_options).invariant_float_math = false;
  (this->msl_options).emulate_cube_array = false;
  (this->msl_options).enable_decoration_binding = false;
  (this->msl_options).texture_buffer_native = false;
  (this->msl_options).force_active_argument_buffer_resources = false;
  (this->msl_options).force_native_arrays = false;
  (this->msl_options).enable_clip_distance_user_varying = true;
  (this->msl_options).multi_patch_workgroup = false;
  (this->msl_options).vertex_for_tessellation = false;
  (this->msl_options).arrayed_subpass_input = false;
  (this->msl_options).vertex_index_type = None;
  p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputs_by_builtin)._M_h._M_buckets = &(this->inputs_by_builtin)._M_h._M_single_bucket;
  (this->inputs_by_builtin)._M_h._M_bucket_count = 1;
  (this->inputs_by_builtin)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inputs_by_builtin)._M_h._M_element_count = 0;
  (this->inputs_by_builtin)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inputs_by_builtin)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inputs_by_builtin)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->inputs_in_use)._M_h._M_buckets = &(this->inputs_in_use)._M_h._M_single_bucket;
  (this->inputs_in_use)._M_h._M_bucket_count = 1;
  (this->inputs_in_use)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inputs_in_use)._M_h._M_element_count = 0;
  (this->inputs_in_use)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inputs_in_use)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inputs_in_use)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->fragment_output_components)._M_h._M_buckets =
       &(this->fragment_output_components)._M_h._M_single_bucket;
  (this->fragment_output_components)._M_h._M_bucket_count = 1;
  (this->fragment_output_components)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fragment_output_components)._M_h._M_element_count = 0;
  (this->fragment_output_components)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fragment_output_components)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fragment_output_components)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->pragma_lines)._M_t._M_impl.super__Rb_tree_header;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->typedef_lines)._M_t._M_impl.super__Rb_tree_header;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->vars_needing_early_declaration).stack_storage;
  (this->vars_needing_early_declaration).buffer_capacity = 8;
  (this->resource_bindings)._M_h._M_buckets = &(this->resource_bindings)._M_h._M_single_bucket;
  (this->resource_bindings)._M_h._M_bucket_count = 1;
  (this->resource_bindings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->resource_bindings)._M_h._M_element_count = 0;
  (this->resource_bindings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->resource_bindings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->resource_bindings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->resource_bindings)._M_h._M_single_bucket + 4) = 0;
  this->next_metal_resource_index_texture = 0;
  this->next_metal_resource_index_sampler = 0;
  this->stage_in_var_id = 0;
  this->stage_out_var_id = 0;
  this->patch_stage_in_var_id = 0;
  this->patch_stage_out_var_id = 0;
  this->stage_in_ptr_var_id = 0;
  this->stage_out_ptr_var_id = 0;
  this->needs_base_vertex_arg = Neutral;
  this->needs_base_instance_arg = Neutral;
  *(undefined8 *)((long)&this->needs_base_vertex_arg + 1) = 0;
  this->builtin_declaration = false;
  this->is_using_builtin_array = false;
  this->is_rasterization_disabled = false;
  this->capture_output_to_buffer = false;
  this->needs_swizzle_buffer_def = false;
  this->used_swizzle_buffer = false;
  this->added_builtin_tess_level = false;
  this->needs_subgroup_invocation_id = false;
  (this->qual_pos_var_name)._M_dataplus._M_p = (pointer)&(this->qual_pos_var_name).field_2;
  (this->qual_pos_var_name)._M_string_length = 0;
  (this->qual_pos_var_name).field_2._M_local_buf[0] = '\0';
  (this->stage_in_var_name)._M_dataplus._M_p = (pointer)&(this->stage_in_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->stage_in_var_name,"in","");
  (this->stage_out_var_name)._M_dataplus._M_p = (pointer)&(this->stage_out_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->stage_out_var_name,"out","");
  (this->patch_stage_in_var_name)._M_dataplus._M_p =
       (pointer)&(this->patch_stage_in_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->patch_stage_in_var_name,"patchIn","");
  (this->patch_stage_out_var_name)._M_dataplus._M_p =
       (pointer)&(this->patch_stage_out_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->patch_stage_out_var_name,"patchOut","");
  (this->sampler_name_suffix)._M_dataplus._M_p = (pointer)&(this->sampler_name_suffix).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->sampler_name_suffix,"Smplr","")
  ;
  (this->swizzle_name_suffix)._M_dataplus._M_p = (pointer)&(this->swizzle_name_suffix).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->swizzle_name_suffix,"Swzl","");
  (this->buffer_size_name_suffix)._M_dataplus._M_p =
       (pointer)&(this->buffer_size_name_suffix).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->buffer_size_name_suffix,"BufferSize","");
  (this->plane_name_suffix)._M_dataplus._M_p = (pointer)&(this->plane_name_suffix).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->plane_name_suffix,"Plane","");
  (this->input_wg_var_name)._M_dataplus._M_p = (pointer)&(this->input_wg_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->input_wg_var_name,"gl_in","");
  (this->input_buffer_var_name)._M_dataplus._M_p = (pointer)&(this->input_buffer_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->input_buffer_var_name,"spvIn","");
  (this->output_buffer_var_name)._M_dataplus._M_p = (pointer)&(this->output_buffer_var_name).field_2
  ;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->output_buffer_var_name,"spvOut","");
  (this->patch_output_buffer_var_name)._M_dataplus._M_p =
       (pointer)&(this->patch_output_buffer_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->patch_output_buffer_var_name,"spvPatchOut","");
  (this->tess_factor_buffer_var_name)._M_dataplus._M_p =
       (pointer)&(this->tess_factor_buffer_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->tess_factor_buffer_var_name,"spvTessLevel","");
  (this->index_buffer_var_name)._M_dataplus._M_p = (pointer)&(this->index_buffer_var_name).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->index_buffer_var_name,"spvIndices","");
  this->previous_instruction_opcode = OpNop;
  p_Var1 = &(this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->constexpr_samplers_by_binding)._M_h._M_buckets =
       &(this->constexpr_samplers_by_binding)._M_h._M_single_bucket;
  (this->constexpr_samplers_by_binding)._M_h._M_bucket_count = 1;
  (this->constexpr_samplers_by_binding)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->constexpr_samplers_by_binding)._M_h._M_element_count = 0;
  (this->constexpr_samplers_by_binding)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->constexpr_samplers_by_binding)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->constexpr_samplers_by_binding)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffers_requiring_array_length)._M_h._M_buckets =
       &(this->buffers_requiring_array_length)._M_h._M_single_bucket;
  (this->buffers_requiring_array_length)._M_h._M_bucket_count = 1;
  (this->buffers_requiring_array_length)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->buffers_requiring_array_length)._M_h._M_element_count = 0;
  (this->buffers_requiring_array_length)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->buffers_requiring_array_length)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->buffers_requiring_array_length)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffer_arrays).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->buffer_arrays).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->buffer_arrays).stack_storage;
  (this->buffer_arrays).buffer_capacity = 8;
  (this->atomic_image_vars)._M_h._M_buckets = &(this->atomic_image_vars)._M_h._M_single_bucket;
  (this->atomic_image_vars)._M_h._M_bucket_count = 1;
  (this->atomic_image_vars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->atomic_image_vars)._M_h._M_element_count = 0;
  (this->atomic_image_vars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->atomic_image_vars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->atomic_image_vars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->disabled_frag_outputs).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->disabled_frag_outputs).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->disabled_frag_outputs).stack_storage;
  (this->disabled_frag_outputs).buffer_capacity = 8;
  (this->inline_uniform_blocks)._M_h._M_buckets =
       &(this->inline_uniform_blocks)._M_h._M_single_bucket;
  (this->inline_uniform_blocks)._M_h._M_bucket_count = 1;
  (this->inline_uniform_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inline_uniform_blocks)._M_h._M_element_count = 0;
  (this->inline_uniform_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inline_uniform_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inline_uniform_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->argument_buffer_discrete_mask = 0;
  this->argument_buffer_device_storage_mask = 0;
  this->suppress_missing_prototypes = false;
  return;
}

Assistant:

CompilerMSL::CompilerMSL(const ParsedIR &ir_)
    : CompilerGLSL(ir_)
{
}